

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cxx
# Opt level: O1

vector<libcalc::Token_*,_std::allocator<libcalc::Token_*>_> * __thiscall
libcalc::Tokenizer::toRPN
          (vector<libcalc::Token_*,_std::allocator<libcalc::Token_*>_> *__return_storage_ptr__,
          Tokenizer *this)

{
  pointer *pppTVar1;
  pointer ppTVar2;
  iterator iVar3;
  int iVar4;
  _Elt_pointer ppTVar5;
  pointer ppTVar6;
  _Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_> local_88;
  Token *local_38;
  Token *t;
  
  (__return_storage_ptr__->super__Vector_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>::_M_initialize_map
            (&local_88,0);
  ppTVar6 = (this->tokens).super__Vector_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppTVar2 = (this->tokens).super__Vector_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppTVar6 == ppTVar2) {
      if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_88._M_impl.super__Deque_impl_data._M_start._M_cur) {
        do {
          ppTVar5 = local_88._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_88._M_impl.super__Deque_impl_data._M_finish._M_first) {
            ppTVar5 = local_88._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
          }
          iVar3._M_current =
               (__return_storage_ptr__->
               super__Vector_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (__return_storage_ptr__->
              super__Vector_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<libcalc::Token*,std::allocator<libcalc::Token*>>::
            _M_realloc_insert<libcalc::Token*const&>
                      ((vector<libcalc::Token*,std::allocator<libcalc::Token*>> *)
                       __return_storage_ptr__,iVar3,ppTVar5 + -1);
          }
          else {
            *iVar3._M_current = ppTVar5[-1];
            pppTVar1 = &(__return_storage_ptr__->
                        super__Vector_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>).
                        _M_impl.super__Vector_impl_data._M_finish;
            *pppTVar1 = *pppTVar1 + 1;
          }
          if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_88._M_impl.super__Deque_impl_data._M_finish._M_first) {
            operator_delete(local_88._M_impl.super__Deque_impl_data._M_finish._M_first);
            local_88._M_impl.super__Deque_impl_data._M_finish._M_first =
                 local_88._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_88._M_impl.super__Deque_impl_data._M_finish._M_last =
                 local_88._M_impl.super__Deque_impl_data._M_finish._M_first + 0x40;
            local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_88._M_impl.super__Deque_impl_data._M_finish._M_first + 0x3f;
            local_88._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_88._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
          }
          else {
            local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
        } while (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                 local_88._M_impl.super__Deque_impl_data._M_start._M_cur);
      }
      std::_Deque_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>::~_Deque_base(&local_88)
      ;
      return __return_storage_ptr__;
    }
    local_38 = *ppTVar6;
    if (local_38->type == '\x01') {
      iVar4 = std::__cxx11::string::compare((char *)local_38);
      if ((iVar4 == 0) || (iVar4 = std::__cxx11::string::compare((char *)local_38), iVar4 == 0)) {
        while (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
               local_88._M_impl.super__Deque_impl_data._M_start._M_cur) {
          ppTVar5 = local_88._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_88._M_impl.super__Deque_impl_data._M_finish._M_first) {
            ppTVar5 = local_88._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
          }
          iVar4 = std::__cxx11::string::compare((char *)ppTVar5[-1]);
          if (iVar4 != 0) {
            ppTVar5 = local_88._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_88._M_impl.super__Deque_impl_data._M_finish._M_first) {
              ppTVar5 = local_88._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
            }
            iVar4 = std::__cxx11::string::compare((char *)ppTVar5[-1]);
            if (iVar4 != 0) {
              ppTVar5 = local_88._M_impl.super__Deque_impl_data._M_finish._M_cur;
              if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  local_88._M_impl.super__Deque_impl_data._M_finish._M_first) {
                ppTVar5 = local_88._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
              }
              iVar4 = std::__cxx11::string::compare((char *)ppTVar5[-1]);
              if (iVar4 != 0) {
                ppTVar5 = local_88._M_impl.super__Deque_impl_data._M_finish._M_cur;
                if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                    local_88._M_impl.super__Deque_impl_data._M_finish._M_first) {
                  ppTVar5 = local_88._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
                }
                iVar4 = std::__cxx11::string::compare((char *)ppTVar5[-1]);
                if (iVar4 != 0) {
                  ppTVar5 = local_88._M_impl.super__Deque_impl_data._M_finish._M_cur;
                  if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                      local_88._M_impl.super__Deque_impl_data._M_finish._M_first) {
                    ppTVar5 = local_88._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
                  }
                  iVar4 = std::__cxx11::string::compare((char *)ppTVar5[-1]);
                  if (iVar4 != 0) {
                    ppTVar5 = local_88._M_impl.super__Deque_impl_data._M_finish._M_cur;
                    if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                        local_88._M_impl.super__Deque_impl_data._M_finish._M_first) {
                      ppTVar5 = local_88._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40
                      ;
                    }
                    iVar4 = std::__cxx11::string::compare((char *)ppTVar5[-1]);
                    if (iVar4 != 0) {
                      ppTVar5 = local_88._M_impl.super__Deque_impl_data._M_finish._M_cur;
                      if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                          local_88._M_impl.super__Deque_impl_data._M_finish._M_first) {
                        ppTVar5 = local_88._M_impl.super__Deque_impl_data._M_finish._M_node[-1] +
                                  0x40;
                      }
                      iVar4 = std::__cxx11::string::compare((char *)ppTVar5[-1]);
                      if (iVar4 != 0) break;
                    }
                  }
                }
              }
            }
          }
          ppTVar5 = local_88._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_88._M_impl.super__Deque_impl_data._M_finish._M_first) {
            ppTVar5 = local_88._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
          }
          iVar3._M_current =
               (__return_storage_ptr__->
               super__Vector_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (__return_storage_ptr__->
              super__Vector_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<libcalc::Token*,std::allocator<libcalc::Token*>>::
            _M_realloc_insert<libcalc::Token*const&>
                      ((vector<libcalc::Token*,std::allocator<libcalc::Token*>> *)
                       __return_storage_ptr__,iVar3,ppTVar5 + -1);
          }
          else {
            *iVar3._M_current = ppTVar5[-1];
            pppTVar1 = &(__return_storage_ptr__->
                        super__Vector_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>).
                        _M_impl.super__Vector_impl_data._M_finish;
            *pppTVar1 = *pppTVar1 + 1;
          }
          if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_88._M_impl.super__Deque_impl_data._M_finish._M_first) {
            operator_delete(local_88._M_impl.super__Deque_impl_data._M_finish._M_first);
            local_88._M_impl.super__Deque_impl_data._M_finish._M_first =
                 local_88._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_88._M_impl.super__Deque_impl_data._M_finish._M_last =
                 local_88._M_impl.super__Deque_impl_data._M_finish._M_first + 0x40;
            local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_88._M_impl.super__Deque_impl_data._M_finish._M_first + 0x3f;
            local_88._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_88._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
          }
          else {
            local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
        }
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)local_38);
        if ((iVar4 == 0) || (iVar4 = std::__cxx11::string::compare((char *)local_38), iVar4 == 0)) {
          while (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                 local_88._M_impl.super__Deque_impl_data._M_start._M_cur) {
            ppTVar5 = local_88._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_88._M_impl.super__Deque_impl_data._M_finish._M_first) {
              ppTVar5 = local_88._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
            }
            iVar4 = std::__cxx11::string::compare((char *)ppTVar5[-1]);
            if (iVar4 != 0) {
              ppTVar5 = local_88._M_impl.super__Deque_impl_data._M_finish._M_cur;
              if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  local_88._M_impl.super__Deque_impl_data._M_finish._M_first) {
                ppTVar5 = local_88._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
              }
              iVar4 = std::__cxx11::string::compare((char *)ppTVar5[-1]);
              if (iVar4 != 0) {
                ppTVar5 = local_88._M_impl.super__Deque_impl_data._M_finish._M_cur;
                if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                    local_88._M_impl.super__Deque_impl_data._M_finish._M_first) {
                  ppTVar5 = local_88._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
                }
                iVar4 = std::__cxx11::string::compare((char *)ppTVar5[-1]);
                if (iVar4 != 0) {
                  ppTVar5 = local_88._M_impl.super__Deque_impl_data._M_finish._M_cur;
                  if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                      local_88._M_impl.super__Deque_impl_data._M_finish._M_first) {
                    ppTVar5 = local_88._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
                  }
                  iVar4 = std::__cxx11::string::compare((char *)ppTVar5[-1]);
                  if (iVar4 != 0) {
                    ppTVar5 = local_88._M_impl.super__Deque_impl_data._M_finish._M_cur;
                    if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                        local_88._M_impl.super__Deque_impl_data._M_finish._M_first) {
                      ppTVar5 = local_88._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40
                      ;
                    }
                    iVar4 = std::__cxx11::string::compare((char *)ppTVar5[-1]);
                    if (iVar4 != 0) break;
                  }
                }
              }
            }
            ppTVar5 = local_88._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_88._M_impl.super__Deque_impl_data._M_finish._M_first) {
              ppTVar5 = local_88._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
            }
            iVar3._M_current =
                 (__return_storage_ptr__->
                 super__Vector_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar3._M_current ==
                (__return_storage_ptr__->
                super__Vector_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<libcalc::Token*,std::allocator<libcalc::Token*>>::
              _M_realloc_insert<libcalc::Token*const&>
                        ((vector<libcalc::Token*,std::allocator<libcalc::Token*>> *)
                         __return_storage_ptr__,iVar3,ppTVar5 + -1);
            }
            else {
              *iVar3._M_current = ppTVar5[-1];
              pppTVar1 = &(__return_storage_ptr__->
                          super__Vector_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>).
                          _M_impl.super__Vector_impl_data._M_finish;
              *pppTVar1 = *pppTVar1 + 1;
            }
            if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_88._M_impl.super__Deque_impl_data._M_finish._M_first) {
              operator_delete(local_88._M_impl.super__Deque_impl_data._M_finish._M_first);
              local_88._M_impl.super__Deque_impl_data._M_finish._M_first =
                   local_88._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
              local_88._M_impl.super__Deque_impl_data._M_finish._M_last =
                   local_88._M_impl.super__Deque_impl_data._M_finish._M_first + 0x40;
              local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_88._M_impl.super__Deque_impl_data._M_finish._M_first + 0x3f;
              local_88._M_impl.super__Deque_impl_data._M_finish._M_node =
                   local_88._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
            }
            else {
              local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
            }
          }
        }
        else {
          iVar4 = std::__cxx11::string::compare((char *)local_38);
          if ((((iVar4 != 0) &&
               (iVar4 = std::__cxx11::string::compare((char *)local_38), iVar4 != 0)) &&
              (iVar4 = std::__cxx11::string::compare((char *)local_38), iVar4 != 0)) &&
             (iVar4 = std::__cxx11::string::compare((char *)local_38), iVar4 != 0)) {
            iVar4 = std::__cxx11::string::compare((char *)local_38);
            if (iVar4 == 0) {
              while (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                     local_88._M_impl.super__Deque_impl_data._M_start._M_cur) {
                ppTVar5 = local_88._M_impl.super__Deque_impl_data._M_finish._M_cur;
                if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                    local_88._M_impl.super__Deque_impl_data._M_finish._M_first) {
                  ppTVar5 = local_88._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
                }
                iVar4 = std::__cxx11::string::compare((char *)ppTVar5[-1]);
                if (iVar4 == 0) break;
                ppTVar5 = local_88._M_impl.super__Deque_impl_data._M_finish._M_cur;
                if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                    local_88._M_impl.super__Deque_impl_data._M_finish._M_first) {
                  ppTVar5 = local_88._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
                }
                iVar3._M_current =
                     (__return_storage_ptr__->
                     super__Vector_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
                if (iVar3._M_current ==
                    (__return_storage_ptr__->
                    super__Vector_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>)._M_impl
                    .super__Vector_impl_data._M_end_of_storage) {
                  std::vector<libcalc::Token*,std::allocator<libcalc::Token*>>::
                  _M_realloc_insert<libcalc::Token*const&>
                            ((vector<libcalc::Token*,std::allocator<libcalc::Token*>> *)
                             __return_storage_ptr__,iVar3,ppTVar5 + -1);
                }
                else {
                  *iVar3._M_current = ppTVar5[-1];
                  pppTVar1 = &(__return_storage_ptr__->
                              super__Vector_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>
                              )._M_impl.super__Vector_impl_data._M_finish;
                  *pppTVar1 = *pppTVar1 + 1;
                }
                if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                    local_88._M_impl.super__Deque_impl_data._M_finish._M_first) {
                  operator_delete(local_88._M_impl.super__Deque_impl_data._M_finish._M_first);
                  local_88._M_impl.super__Deque_impl_data._M_finish._M_first =
                       local_88._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
                  local_88._M_impl.super__Deque_impl_data._M_finish._M_last =
                       local_88._M_impl.super__Deque_impl_data._M_finish._M_first + 0x40;
                  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
                       local_88._M_impl.super__Deque_impl_data._M_finish._M_first + 0x3f;
                  local_88._M_impl.super__Deque_impl_data._M_finish._M_node =
                       local_88._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
                }
                else {
                  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
                       local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
                }
              }
              if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  local_88._M_impl.super__Deque_impl_data._M_finish._M_first) {
                operator_delete(local_88._M_impl.super__Deque_impl_data._M_finish._M_first);
                local_88._M_impl.super__Deque_impl_data._M_finish._M_first =
                     local_88._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
                local_88._M_impl.super__Deque_impl_data._M_finish._M_last =
                     local_88._M_impl.super__Deque_impl_data._M_finish._M_first + 0x40;
                local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
                     local_88._M_impl.super__Deque_impl_data._M_finish._M_first + 0x3f;
                local_88._M_impl.super__Deque_impl_data._M_finish._M_node =
                     local_88._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
              }
              else {
                local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
                     local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
              }
            }
            goto LAB_00102fdd;
          }
        }
      }
      if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<libcalc::Token*,std::allocator<libcalc::Token*>>::
        _M_push_back_aux<libcalc::Token*const&>
                  ((deque<libcalc::Token*,std::allocator<libcalc::Token*>> *)&local_88,&local_38);
      }
      else {
        *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = local_38;
        local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
    }
    else {
      iVar3._M_current =
           (__return_storage_ptr__->
           super__Vector_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<libcalc::Token*,std::allocator<libcalc::Token*>>::
        _M_realloc_insert<libcalc::Token*const&>
                  ((vector<libcalc::Token*,std::allocator<libcalc::Token*>> *)__return_storage_ptr__
                   ,iVar3,&local_38);
      }
      else {
        *iVar3._M_current = local_38;
        pppTVar1 = &(__return_storage_ptr__->
                    super__Vector_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>)._M_impl
                    .super__Vector_impl_data._M_finish;
        *pppTVar1 = *pppTVar1 + 1;
      }
    }
LAB_00102fdd:
    ppTVar6 = ppTVar6 + 1;
  } while( true );
}

Assistant:

std::vector<Token *> Tokenizer::toRPN() {
  std::vector<Token *> rpn;
  std::stack<Token *> op;

  for (auto t : tokens) {
    if (t->type != TOKEN_TYPE.OPERATOR) {
      rpn.push_back(t);
      continue;
    } else if (t->value == "+" || t->value == "-") {

        while( !op.empty() &&
            (op.top()->value == "-" ||
             op.top()->value == "+" ||
             op.top()->value == "*" ||
             op.top()->value == "/" ||
             op.top()->value == "%" ||
             op.top()->value == "!" ||
             op.top()->value == "^" )) {

          rpn.push_back(op.top());
          op.pop();
        }

        op.push(t);

    } else if (t->value == "*" || t->value == "/") {

        while( !op.empty() &&
            (op.top()->value == "*" ||
             op.top()->value == "/" ||
             op.top()->value == "%" ||
             op.top()->value == "!" ||
             op.top()->value == "^" )) {

          rpn.push_back(op.top());
          op.pop();
        }
        op.push(t);

    } else if (t->value == "(" ||
               t->value == "^" ||
               t->value == "%" ||
               t->value == "!") {

      op.push(t);

    } else if (t->value == ")") {
      while (!op.empty() && op.top()->value != "(") {
        rpn.push_back(op.top());
        op.pop();
      }
      op.pop();
    }
  }

  while(!op.empty()) {
    rpn.push_back(op.top());
    op.pop();
  }

  return rpn;
}